

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void mips_tr_translate_insn(DisasContextBase *dcbase,CPUState *cs)

{
  DisasJumpType DVar1;
  CPUArchState_conflict14 *env;
  uc_struct_conflict7 *val;
  TCGContext_conflict6 *pTVar2;
  void *pvVar3;
  hook *phVar4;
  TCGContext_conflict6 *pTVar5;
  int16_t imm;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  int32_t offset;
  uintptr_t o_3;
  undefined1 *puVar9;
  list_item *plVar10;
  TCGv_i32 pTVar11;
  TCGv_i64 pTVar12;
  TCGv_i64 pTVar13;
  TCGLabel *l;
  byte rt;
  uint uVar14;
  uintptr_t o_17;
  byte count;
  uint uVar15;
  int iVar16;
  uintptr_t o_9;
  ulong uVar17;
  ushort uVar18;
  uint uVar19;
  uintptr_t o_1;
  TCGTemp *pTVar20;
  target_ulong tVar21;
  uintptr_t o_21;
  uint uVar22;
  int16_t iVar23;
  int iVar24;
  uint uVar25;
  char cVar26;
  int iVar27;
  uint uVar28;
  uintptr_t o_5;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar29;
  uintptr_t o;
  TCGTemp *pTVar30;
  ulong uVar31;
  uint uVar32;
  int iVar33;
  uintptr_t o_2;
  TCGTemp *ts;
  uint uVar34;
  bool bVar35;
  TCGTemp *args [1];
  uint uVar36;
  int local_88;
  int local_84;
  void *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  env = (CPUArchState_conflict14 *)cs->env_ptr;
  val = cs->uc;
  pTVar2 = val->tcg_ctx;
  uVar32 = (uint)dcbase[2].pc_next & 0x87f800;
  local_78 = (TCGTemp *)dcbase->pc_next;
  if (val->use_exits == 0) {
    bVar35 = (TCGTemp *)val->exits[(long)val->nested_level + -1] == local_78;
  }
  else {
    puVar9 = (undefined1 *)g_tree_lookup(val->ctl_exits,&local_78);
    bVar35 = puVar9 == &DAT_00000001;
  }
  if (bVar35) {
    local_78 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
    tcg_gen_callN_mips64el(pTVar2,helper_wait_mips64el,(TCGTemp *)0x0,1,&local_78);
    dcbase->is_jmp = DISAS_NORETURN;
    return;
  }
  uVar17 = dcbase->pc_next;
  for (plVar10 = val->hook[2].head; bVar35 = plVar10 != (list_item *)0x0, bVar35;
      plVar10 = plVar10->next) {
    pvVar3 = plVar10->data;
    if ((((*(ulong *)((long)pvVar3 + 0x18) <= uVar17) && (uVar17 <= *(ulong *)((long)pvVar3 + 0x20))
         ) || (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))) &&
       (*(char *)((long)pvVar3 + 0x14) != '\x01')) break;
  }
  if (bVar35) {
    tcg_gen_op2_mips64el(pTVar2,INDEX_op_movi_i64,(TCGArg)(pTVar2->cpu_pc + (long)pTVar2),uVar17);
    local_80 = ((pTVar2->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
    tVar21 = dcbase->pc_next;
    pTVar11 = tcg_const_i32_mips64el(pTVar2,4);
    pTVar12 = tcg_const_i64_mips64el(pTVar2,(int64_t)val);
    pTVar13 = tcg_const_i64_mips64el(pTVar2,tVar21);
    pTVar30 = (TCGTemp *)(pTVar12 + (long)pTVar2);
    pTVar20 = (TCGTemp *)(pTVar13 + (long)pTVar2);
    ts = (TCGTemp *)(pTVar11 + (long)pTVar2);
    local_40 = (TCGTemp *)0x0;
    local_58 = pTVar30;
    local_50 = pTVar20;
    local_48 = ts;
    if (val->hooks_count[2] == 1) {
      for (plVar10 = val->hook[2].head; plVar10 != (list_item *)0x0; plVar10 = plVar10->next) {
        phVar4 = (hook *)plVar10->data;
        if (phVar4->to_delete == false) {
          pTVar12 = tcg_const_i64_mips64el(pTVar2,(int64_t)phVar4->user_data);
          local_40 = (TCGTemp *)(pTVar12 + (long)pTVar2);
          (*val->add_inline_hook)(val,phVar4,&local_58,4);
          tcg_temp_free_internal_mips64el(pTVar2,(TCGTemp *)(pTVar12 + (long)pTVar2));
        }
      }
    }
    else {
      pTVar11 = tcg_const_i32_mips64el(pTVar2,2);
      local_78 = ts;
      local_70 = (TCGTemp *)(pTVar11 + (long)pTVar2);
      local_68 = pTVar30;
      local_60 = pTVar20;
      tcg_gen_callN_mips64el(pTVar2,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_78);
      tcg_temp_free_internal_mips64el(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
    }
    tcg_temp_free_internal_mips64el(pTVar2,pTVar20);
    tcg_temp_free_internal_mips64el(pTVar2,pTVar30);
    tcg_temp_free_internal_mips64el(pTVar2,ts);
    if (uVar32 == 0) {
      check_exit_request_mips64el(pTVar2);
    }
  }
  else {
    local_80 = (void *)0x0;
  }
  uVar17._0_4_ = dcbase[1].is_jmp;
  uVar17._4_4_ = dcbase[1].num_insns;
  if ((short)(undefined4)uVar17 < 0) {
    uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
    *(uint32_t *)&dcbase[1].pc_next = uVar6;
    pTVar5 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
    if ((dcbase->pc_next & 1) != 0) {
      pTVar12 = tcg_const_i64_mips64el(pTVar5,dcbase->pc_next);
      tcg_gen_op3_mips64el
                (pTVar5,INDEX_op_st_i64,(TCGArg)(pTVar12 + (long)pTVar5),
                 (TCGArg)(pTVar5->cpu_env + (long)pTVar5),0x648);
      tcg_temp_free_internal_mips64el(pTVar5,(TCGTemp *)(pTVar12 + (long)pTVar5));
LAB_0098e94f:
      iVar24 = 0xc;
      goto LAB_0098e957;
    }
    uVar34 = uVar6 >> 10 & 0x3f;
    if (0x3b < uVar34 - 4) {
switchD_0098e81e_caseD_8:
      uVar34 = decode_nanomips_32_48_opc
                         ((CPUMIPSState_conflict8 *)env,(DisasContext_conflict6 *)dcbase);
      goto LAB_009905ff;
    }
    uVar8 = uVar6 >> 7 & 7;
    uVar17 = (ulong)uVar8;
    uVar14 = *(uint *)(decode_gpr_gpr3_map + uVar17 * 4);
    uVar15 = uVar6 >> 4 & 7;
    uVar36 = *(uint *)(decode_gpr_gpr3_map + (ulong)uVar15 * 4);
    uVar28 = *(uint *)(decode_gpr_gpr3_map + (ulong)(uVar6 & 0xe) * 2);
    switch(uVar34) {
    case 4:
      uVar28 = uVar6 >> 5 & 0x1f;
      if (uVar28 == 0) {
        switch(uVar6 >> 3 & 3) {
        case 0:
          goto switchD_0098e9c3_caseD_29;
        case 1:
          if ((uVar6 & 4) != 0) goto switchD_0098e9c3_caseD_29;
          iVar24 = 0x11;
          break;
        case 2:
          iVar24 = 0x12;
          break;
        case 3:
          if ((dcbase[2].pc_next & 0x400000) != 0) goto switchD_0098e9c3_caseD_29;
          iVar24 = 0x10;
        }
        goto LAB_0098e957;
      }
      uVar36 = uVar6 & 0x1f;
      uVar6 = 0x21;
      uVar14 = 0;
      goto LAB_0098f233;
    case 5:
      uVar8 = (uVar6 & 0xf) << 2;
      goto LAB_0098efce;
    case 6:
      iVar24 = (uVar6 & 0x3fe) + (uVar6 & 1) * -0x400;
      uVar7 = 0x10000000;
      goto LAB_0098eecb;
    case 7:
      rt = (byte)(uVar6 >> 9) & 1 | 0x1e;
      count = (byte)uVar6 & 0xf;
      uVar18 = (ushort)uVar6 & 0xf0;
      if ((uVar6 >> 8 & 1) != 0) {
        gen_restore((DisasContext_conflict6 *)dcbase,rt,count,'\0',uVar18);
        uVar7 = 8;
        uVar36 = 0x1f;
        uVar14 = 0;
        iVar24 = 0;
        goto LAB_0098f030;
      }
      gen_save((DisasContext_conflict6 *)dcbase,rt,count,'\0',uVar18);
      break;
    default:
      goto switchD_0098e81e_caseD_8;
    case 0xc:
      iVar23 = 8;
      if ((uVar6 & 7) != 0) {
        iVar23 = (int16_t)(uVar6 & 7);
      }
      gen_shift_imm((DisasContext_conflict6 *)dcbase,uVar6 >> 2 & 2,uVar14,uVar36,iVar23);
      break;
    case 0xd:
      uVar14 = uVar6 >> 5 & 0x1f;
      uVar8 = (uVar6 & 0x1f) << 2;
      uVar36 = 0x1d;
      goto LAB_0098efce;
    case 0xe:
      iVar24 = (uVar6 & 0x3fe) + (uVar6 & 1) * -0x400;
      uVar7 = 0x4110000;
LAB_0098eecb:
      uVar36 = 0;
      goto LAB_0098f02a;
    case 0xf:
      uVar28 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar6 >> 5 & 7 | uVar6 >> 6 & 8) * 4);
      uVar14 = *(uint *)(decode_gpr_gpr4_map + (ulong)((uVar6 & 7) + (uVar6 >> 4 & 1) * 8) * 4);
      uVar34 = uVar6 >> 3 & 1 | uVar6 >> 7 & 2;
      if (uVar34 != 1) {
        if (uVar34 == 0) {
          if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
            generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
          }
          uVar6 = 0x21;
          uVar34 = uVar28;
          goto LAB_009907a4;
        }
        goto switchD_0098e9c3_caseD_29;
      }
      if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      gen_r6_muldiv((DisasContext_conflict6 *)dcbase,0x98,uVar28,uVar14,uVar28);
      goto LAB_0098e95e;
    case 0x14:
      if ((uVar6 & 1) == 0) {
        gen_pool16c_nanomips_insn((DisasContext_conflict6 *)dcbase);
      }
      else {
        gen_ldxs((DisasContext_conflict6 *)dcbase,uVar14,uVar36,uVar28);
      }
      break;
    case 0x15:
      uVar8 = (uVar6 & 0x7f) << 2;
      uVar36 = 0x1c;
LAB_0098efce:
      uVar6 = 0x8c000000;
LAB_0098f429:
      gen_ld((DisasContext_conflict6 *)dcbase,uVar6,uVar14,uVar36,uVar8);
      break;
    case 0x17:
      uVar8 = uVar6 & 3;
      switch(uVar6 >> 2 & 3) {
      case 0:
        uVar6 = 0x80000000;
        break;
      case 1:
        uVar28 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar17 * 4);
        uVar6 = 0xa0000000;
        goto LAB_0098ef7d;
      case 2:
        uVar6 = 0x90000000;
        break;
      case 3:
switchD_0098ecad_caseD_3:
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        goto LAB_0098f42e;
      }
      goto LAB_0098f429;
    case 0x1c:
      if ((uVar6 & 0x40) == 0) goto switchD_0098ecad_caseD_3;
      uVar34 = uVar6 & 0x3f;
      uVar36 = 0x1d;
      goto LAB_0098f1ae;
    case 0x1d:
      if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar34 = (uint)dcbase[1].pc_next;
      uVar8 = uVar34 >> 6 & 4 | uVar34 & 8;
      uVar14 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar34 >> 5 & 7 | uVar34 >> 6 & 8) * 4);
      uVar36 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar34 & 7 | uVar34 >> 1 & 8) * 4);
      uVar6 = 0x8c000000;
      goto LAB_0098f429;
    case 0x1f:
      (*(code *)(&DAT_00da7540 + *(int *)(&DAT_00da7540 + (ulong)(uVar6 & 1 | uVar6 >> 2 & 2) * 4)))
                ();
      return;
    case 0x24:
      if ((uVar6 & 8) != 0) {
        uVar34 = 2;
        uVar28 = uVar6 >> 5 & 0x1f;
        if (uVar28 != 0) {
          gen_arith_imm((DisasContext_conflict6 *)dcbase,0x24000000,uVar28,uVar28,
                        uVar6 & 7 | (int)(uVar6 << 0x1b) >> 0x1c & 0xfffffff8U);
        }
        goto LAB_009905ff;
      }
      uVar34 = uVar6 & 7;
LAB_0098f1ae:
      gen_arith_imm((DisasContext_conflict6 *)dcbase,0x24000000,uVar14,uVar36,uVar34 << 2);
      break;
    case 0x25:
      uVar28 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar17 * 4);
      uVar8 = (uVar6 & 0xf) << 2;
      goto LAB_0098ef7a;
    case 0x26:
      iVar24 = (uVar6 & 0x7e) + (uVar6 & 1) * -0x80;
      uVar7 = 0x10000000;
      uVar36 = uVar14;
      goto LAB_0098f02a;
    case 0x2c:
      if ((uVar6 & 1) == 0) {
        uVar6 = 0x21;
      }
      else {
        uVar6 = 0x23;
      }
LAB_0098f233:
      gen_arith((DisasContext_conflict6 *)dcbase,uVar6,uVar28,uVar36,uVar14);
      break;
    case 0x2d:
      uVar28 = uVar6 >> 5 & 0x1f;
      uVar8 = (uVar6 & 0x1f) << 2;
      uVar36 = 0x1d;
      goto LAB_0098ef7a;
    case 0x2e:
      iVar24 = (uVar6 & 0x7e) + (uVar6 & 1) * -0x80;
      uVar7 = 0x14000000;
      uVar36 = uVar14;
LAB_0098f02a:
      uVar14 = 0;
LAB_0098f030:
      uVar34 = 2;
      gen_compute_branch_nm((DisasContext_conflict6 *)dcbase,uVar7,2,uVar36,uVar14,iVar24);
      goto LAB_009905ff;
    case 0x2f:
    case 0x3f:
      if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar28 = (uint)dcbase[1].pc_next;
      uVar14 = (uVar28 >> 8 & 1 | uVar28 >> 2 & 2) << 2;
      iVar24 = *(int *)(decode_nanomips_opc_gpr2reg1 + uVar14);
      iVar16 = *(int *)(decode_nanomips_opc_gpr2reg2 + uVar14);
      uVar31 = (ulong)(uVar28 & 7 | uVar28 >> 1 & 8);
      uVar17 = (ulong)(uVar28 >> 5 & 7 | uVar28 >> 6 & 8);
      pTVar20 = tcg_temp_new_internal_mips64el(pTVar5,TCG_TYPE_I64,false);
      pTVar30 = tcg_temp_new_internal_mips64el(pTVar5,TCG_TYPE_I64,false);
      if (uVar34 == 0x2f) {
        iVar27 = *(int *)(decode_gpr_gpr4_zero_map + uVar31 * 4);
        iVar33 = *(int *)(decode_gpr_gpr4_zero_map + uVar17 * 4);
        local_88 = iVar24;
        local_84 = iVar16;
      }
      else {
        local_88 = *(int *)(decode_gpr_gpr4_map + uVar31 * 4);
        local_84 = *(int *)(decode_gpr_gpr4_map + uVar17 * 4);
        iVar27 = iVar24;
        iVar33 = iVar16;
      }
      pTVar12 = (TCGv_i64)((long)pTVar20 - (long)pTVar5);
      if (iVar27 == 0) {
        tcg_gen_op2_mips64el(pTVar5,INDEX_op_movi_i64,(TCGArg)pTVar20,0);
      }
      else if (pTVar5->cpu_gpr[iVar27] != pTVar12) {
        tcg_gen_op2_mips64el
                  (pTVar5,INDEX_op_mov_i64,(TCGArg)pTVar20,
                   (TCGArg)((long)&pTVar5->pool_cur + (long)pTVar5->cpu_gpr[iVar27]));
      }
      pTVar13 = (TCGv_i64)((long)pTVar30 - (long)pTVar5);
      if (iVar33 == 0) {
        tcg_gen_op2_mips64el(pTVar5,INDEX_op_movi_i64,(TCGArg)pTVar30,0);
      }
      else if (pTVar5->cpu_gpr[iVar33] != pTVar13) {
        tcg_gen_op2_mips64el
                  (pTVar5,INDEX_op_mov_i64,(TCGArg)pTVar30,
                   (TCGArg)((long)&pTVar5->pool_cur + (long)pTVar5->cpu_gpr[iVar33]));
      }
      if (pTVar5->cpu_gpr[local_88] != pTVar12) {
        tcg_gen_op2_mips64el
                  (pTVar5,INDEX_op_mov_i64,
                   (TCGArg)((long)&pTVar5->pool_cur + (long)pTVar5->cpu_gpr[local_88]),
                   (TCGArg)pTVar20);
      }
      if (pTVar5->cpu_gpr[local_84] != pTVar13) {
        tcg_gen_op2_mips64el
                  (pTVar5,INDEX_op_mov_i64,
                   (TCGArg)((long)&pTVar5->pool_cur + (long)pTVar5->cpu_gpr[local_84]),
                   (TCGArg)pTVar30);
      }
      tcg_temp_free_internal_mips64el(pTVar5,(TCGTemp *)(pTVar12 + (long)pTVar5));
      tcg_temp_free_internal_mips64el(pTVar5,(TCGTemp *)(pTVar13 + (long)pTVar5));
      goto LAB_0098e95e;
    case 0x34:
      uVar34 = 0xffffffff;
      if ((uVar6 & 0x7f) != 0x7f) {
        uVar34 = uVar6 & 0x7f;
      }
      tcg_gen_op2_mips64el
                (pTVar5,INDEX_op_movi_i64,
                 (TCGArg)((long)&pTVar5->pool_cur + (long)pTVar5->cpu_gpr[(int)uVar14]),
                 (long)(int)uVar34);
      break;
    case 0x35:
      uVar28 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar17 * 4);
      uVar8 = (uVar6 & 0x7f) << 2;
      uVar36 = 0x1c;
LAB_0098ef7a:
      uVar6 = 0xac000000;
LAB_0098ef7d:
      gen_st((DisasContext_conflict6 *)dcbase,uVar6,uVar28,uVar36,uVar8);
      break;
    case 0x36:
      if ((uVar6 & 0xf) == 0) {
        uVar34 = 2;
        if ((uVar6 & 0x10) == 0) {
          uVar7 = 8;
          iVar24 = 0;
        }
        else {
          uVar7 = 9;
          iVar24 = 0x1f;
        }
        gen_compute_branch_nm((DisasContext_conflict6 *)dcbase,uVar7,2,uVar6 >> 5 & 0x1f,iVar24,0);
        goto LAB_009905ff;
      }
      uVar7 = (uVar8 <= uVar15 | 4) << 0x1a;
      iVar24 = (uVar6 & 0xf) * 2;
      goto LAB_0098f030;
    case 0x3c:
      uVar34 = uVar6 & 0xf;
      iVar23 = -1;
      if (uVar34 != 0xd) {
        iVar23 = (int16_t)uVar34;
      }
      imm = 0xff;
      if (uVar34 != 0xc) {
        imm = iVar23;
      }
      gen_logic_imm((DisasContext_conflict6 *)dcbase,0x30000000,uVar14,uVar36,imm);
      break;
    case 0x3d:
      if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar34 = (uint)dcbase[1].pc_next;
      uVar8 = uVar34 >> 6 & 4 | uVar34 & 8;
      uVar28 = *(uint *)(decode_gpr_gpr4_zero_map + (ulong)(uVar34 >> 5 & 7 | uVar34 >> 6 & 8) * 4);
      uVar36 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar34 & 7 | uVar34 >> 1 & 8) * 4);
      uVar6 = 0xac000000;
      goto LAB_0098ef7d;
    }
LAB_0098f42e:
    uVar34 = 2;
    goto LAB_009905ff;
  }
  if ((dcbase[2].pc_next & 0x400) == 0) {
    uVar6 = cpu_ldl_code_mips64el(env,dcbase->pc_next);
    *(uint32_t *)&dcbase[1].pc_next = uVar6;
    if ((dcbase->pc_next & 3) == 0) {
      pTVar2 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      if ((dcbase[2].pc_next & 0x803800) == 0x1800) {
        l = gen_new_label_mips64el(pTVar2);
        tcg_gen_brcondi_i64_mips64el(pTVar2,TCG_COND_NE,pTVar2->bcond,0,l);
        tcg_gen_op2_mips64el
                  (pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->hflags + (long)pTVar2),
                   (long)(int)dcbase[2].pc_next & 0xffffffffff7807ff);
        gen_goto_tb((DisasContext_conflict6 *)dcbase,1,dcbase->pc_next + 4);
        *(byte *)l = *(byte *)l | 1;
        tcg_gen_op1_mips64el(pTVar2,INDEX_op_set_label,(TCGArg)l);
      }
      (*(code *)(&DAT_00da785c +
                *(int *)(&DAT_00da785c + (ulong)((uint)dcbase[1].pc_next >> 0x1a ^ 0x20) * 4)))();
      return;
    }
    env->CP0_BadVAddr = dcbase->pc_next;
    generate_exception_err((DisasContext_conflict6 *)dcbase,0xc,2);
LAB_0098e794:
    uVar34 = 4;
    goto LAB_009905ff;
  }
  if ((uVar17 >> 0x28 & 1) != 0) {
    uVar7 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
    *(uint32_t *)&dcbase[1].pc_next = uVar7;
    if ((dcbase->pc_next & 1) != 0) {
      env->CP0_BadVAddr = dcbase->pc_next;
      goto LAB_0098e94f;
    }
    pTVar5 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
    uVar34 = (uint)dcbase[2].pc_next;
    if ((uVar34 >> 0x11 & 1) != 0) {
      if ((uVar7 >> 10 & 7) - 1 < 3) {
        if ((uVar34 >> 0x10 & 1) == 0) goto LAB_0098e9a6;
      }
      else if (-1 < (short)uVar34) goto LAB_0098e9a6;
switchD_0098e9c3_caseD_29:
      iVar24 = 0x14;
LAB_0098e957:
      generate_exception_err((DisasContext_conflict6 *)dcbase,iVar24,0);
      goto LAB_0098e95e;
    }
LAB_0098e9a6:
    uVar34 = uVar7 >> 10 & 0x3f;
    switch(uVar34) {
    case 1:
      uVar14 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar28 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar6 = (uVar7 & 1) * 2 + 0x21;
      uVar34 = *(uint *)(xlat_map + (ulong)(uVar7 & 0xe) * 2);
      if ((dcbase[1].is_jmp & 0x2000) == DISAS_NEXT) {
        uVar34 = uVar14;
        uVar14 = *(uint *)(xlat_map + (ulong)(uVar7 & 0xe) * 2);
      }
      goto LAB_009907a4;
    case 2:
      uVar28 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar14 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar34 = 0xffffffff;
      if ((uVar7 & 0xf) != 0xf) {
        uVar34 = uVar7 & 0xf;
      }
      uVar6 = 0x90000000;
      goto LAB_0098fc2a;
    case 3:
      uVar6 = 0x21;
      uVar28 = 0;
      uVar34 = uVar7 >> 5 & 0x1f;
      uVar14 = uVar7 & 0x1f;
      goto LAB_009907a4;
    default:
      decode_micromips32_opc((CPUMIPSState_conflict8 *)env,(DisasContext_conflict6 *)dcbase);
      goto LAB_0098e794;
    case 9:
      uVar34 = uVar7 >> 1 & 7;
      iVar23 = 8;
      if (uVar34 != 0) {
        iVar23 = (int16_t)uVar34;
      }
      gen_shift_imm((DisasContext_conflict6 *)dcbase,(uVar7 & 1) * 2,
                    *(int *)(xlat_map + (uVar7 >> 5 & 0x1c)),
                    *(int *)(xlat_map + (uVar7 >> 2 & 0x1c)),iVar23);
      break;
    case 10:
      uVar28 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar14 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar34 = uVar7 * 2 & 0x1e;
      uVar6 = 0x94000000;
      goto LAB_0098fc2a;
    case 0xb:
      gen_andi16((DisasContext_conflict6 *)dcbase);
      break;
    case 0x11:
      if ((dcbase[1].is_jmp & 0x2000) == DISAS_NEXT) {
        gen_pool16c_insn((DisasContext_conflict6 *)dcbase);
      }
      else {
        gen_pool16c_r6_insn((DisasContext_conflict6 *)dcbase);
      }
      break;
    case 0x12:
      uVar28 = uVar7 >> 5 & 0x1f;
      uVar34 = (uVar7 & 0x1f) << 2;
      uVar6 = 0x8c000000;
      uVar14 = 0x1d;
      goto LAB_0098fc2a;
    case 0x13:
      if ((uVar7 & 1) == 0) {
        gen_addius5((DisasContext_conflict6 *)dcbase);
      }
      else {
        gen_addiusp((DisasContext_conflict6 *)dcbase);
      }
      break;
    case 0x19:
      uVar28 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar34 = (int)(uVar7 << 0x19) >> 0x17;
      uVar6 = 0x8c000000;
      uVar14 = 0x1c;
      goto LAB_0098fc2a;
    case 0x1a:
      uVar28 = *(uint *)(xlat_map + (uVar7 >> 5 & 0x1c));
      uVar14 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar34 = (uVar7 & 0xf) << 2;
      uVar6 = 0x8c000000;
LAB_0098fc2a:
      gen_ld((DisasContext_conflict6 *)dcbase,uVar6,uVar28,uVar14,uVar34);
      break;
    case 0x1b:
      if ((uVar7 & 1) == 0) {
        gen_addiur2((DisasContext_conflict6 *)dcbase);
      }
      else {
        gen_addiur1sp((DisasContext_conflict6 *)dcbase);
      }
      break;
    case 0x21:
      if ((dcbase[1].is_jmp & 0x2000) != DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar34 = (uint)dcbase[1].pc_next;
      if ((uVar34 & 1) != 0) goto switchD_0098e9c3_caseD_29;
      gen_movep((DisasContext_conflict6 *)dcbase,uVar34 >> 7 & 7,uVar34 >> 4 & 7,uVar34 >> 1 & 7);
      break;
    case 0x22:
      uVar28 = *(uint *)(mmreg2_map + (uVar7 >> 5 & 0x1c));
      uVar14 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar34 = uVar7 & 0xf;
      uVar6 = 0xa0000000;
      goto LAB_0098fcd2;
    case 0x23:
    case 0x2b:
      uVar6 = (uVar34 == 0x2b | 4) << 0x1a;
      iVar24 = *(int *)(xlat_map + (uVar7 >> 5 & 0x1c));
      offset = (int)(uVar7 << 0x19) >> 0x18;
      DVar1 = dcbase[1].is_jmp;
      goto LAB_0098f9dd;
    case 0x29:
    case 0x31:
    case 0x39:
      goto switchD_0098e9c3_caseD_29;
    case 0x2a:
      uVar28 = *(uint *)(mmreg2_map + (uVar7 >> 5 & 0x1c));
      uVar14 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar34 = uVar7 * 2 & 0x1e;
      uVar6 = 0xa4000000;
      goto LAB_0098fcd2;
    case 0x32:
      uVar28 = uVar7 >> 5 & 0x1f;
      uVar34 = (uVar7 & 0x1f) << 2;
      uVar6 = 0xac000000;
      uVar14 = 0x1d;
      goto LAB_0098fcd2;
    case 0x33:
      offset = (int)(uVar7 << 0x16) >> 0x15;
      DVar1 = dcbase[1].is_jmp;
      uVar6 = 0x10000000;
      iVar24 = 0;
LAB_0098f9dd:
      uVar34 = 2;
      gen_compute_branch((DisasContext_conflict6 *)dcbase,uVar6,2,iVar24,0,offset,~DVar1 >> 0xb & 4)
      ;
      goto LAB_009905ff;
    case 0x3a:
      uVar28 = *(uint *)(mmreg2_map + (uVar7 >> 5 & 0x1c));
      uVar14 = *(uint *)(xlat_map + (uVar7 >> 2 & 0x1c));
      uVar34 = (uVar7 & 0xf) << 2;
      uVar6 = 0xac000000;
LAB_0098fcd2:
      gen_st((DisasContext_conflict6 *)dcbase,uVar6,uVar28,uVar14,uVar34);
      break;
    case 0x3b:
      uVar34 = 0xffffffff;
      if ((uVar7 & 0x7f) != 0x7f) {
        uVar34 = uVar7 & 0x7f;
      }
      tcg_gen_op2_mips64el
                (pTVar5,INDEX_op_movi_i64,
                 (TCGArg)((long)&pTVar5->pool_cur +
                         (long)pTVar5->cpu_gpr[*(int *)(xlat_map + (uVar7 >> 5 & 0x1c))]),
                 (long)(int)uVar34);
    }
LAB_0098e95e:
    uVar34 = 2;
    goto LAB_009905ff;
  }
  if ((uVar17 >> 0x20 & 1) == 0) {
    generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    if (dcbase->is_jmp == DISAS_NORETURN) {
      return;
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/translate.c"
               ,0x78fe,"ctx->base.is_jmp == DISAS_NORETURN");
  }
  uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
  *(uint32_t *)&dcbase[1].pc_next = uVar6;
  pTVar5 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  uVar8 = uVar6 >> 2 & 7;
  uVar36 = 8;
  if (uVar8 != 0) {
    uVar36 = uVar8;
  }
  uVar15 = uVar6 >> 8 & 7;
  uVar14 = *(uint *)(xlat_map + (ulong)uVar15 * 4);
  uVar19 = uVar6 >> 5 & 7;
  uVar28 = *(uint *)(xlat_map + (ulong)uVar19 * 4);
  uVar34 = uVar6 & 0x1f;
  cVar26 = (char)uVar6;
  iVar23 = (int16_t)uVar36;
  uVar36 = uVar14;
  switch(uVar6 >> 0xb & 0x1f) {
  case 0:
    iVar24 = (uVar6 & 0xff) << 2;
LAB_0098eba3:
    uVar36 = 0x1d;
    uVar28 = uVar14;
    goto LAB_0098f790;
  case 1:
    gen_addiupc((DisasContext_conflict6 *)dcbase,uVar14,(uVar6 & 0xff) << 2,0,0);
    break;
  case 2:
    iVar24 = (int)(short)(uVar6 << 5) >> 4;
    uVar34 = 2;
    iVar16 = 2;
LAB_0098f570:
    uVar7 = 0x10000000;
    uVar14 = 0;
    goto LAB_009905ed;
  case 3:
    uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next + 2);
    uVar34 = (uint)dcbase[1].pc_next;
    iVar24 = ((uVar34 & 0x3e0) << 0xb | uVar6 | (uVar34 & 0x1f) << 0x15) << 2;
    uVar7 = 0x74000000;
    if ((uVar34 >> 10 & 1) == 0) {
      uVar7 = 0xc000000;
    }
    uVar36 = 2;
    uVar34 = 4;
    iVar16 = 4;
    goto LAB_009905f0;
  case 4:
    uVar7 = 0x10000000;
    goto LAB_0098f6cd;
  case 5:
    uVar7 = 0x14000000;
LAB_0098f6cd:
    iVar24 = (int)cVar26;
    uVar34 = 2;
    iVar16 = 2;
LAB_009905ea:
    iVar24 = iVar24 * 2;
LAB_009905ed:
    uVar36 = 0;
    uVar28 = 0;
LAB_009905f0:
    gen_compute_branch((DisasContext_conflict6 *)dcbase,uVar7,iVar16,uVar14,uVar28,iVar24,uVar36);
    goto LAB_009905ff;
  case 6:
    switch(uVar6 & 3) {
    case 0:
      uVar6 = 0;
      break;
    case 1:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      gen_shift_imm((DisasContext_conflict6 *)dcbase,0x38,uVar14,uVar28,iVar23);
      uVar34 = 2;
      goto LAB_009905ff;
    case 2:
      uVar34 = 2;
      gen_shift_imm((DisasContext_conflict6 *)dcbase,2,uVar14,uVar28,iVar23);
      goto LAB_009905ff;
    case 3:
      uVar6 = 3;
    }
    goto LAB_009906f4;
  case 7:
    if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    if ((dcbase[2].pc_next & 8) == 0) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    uVar34 = uVar34 << 3;
    uVar6 = 0xdc000000;
    goto LAB_0098fc2a;
  case 8:
    if ((uVar6 & 0x10) != 0) {
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      gen_arith_imm((DisasContext_conflict6 *)dcbase,0x64000000,uVar28,uVar14,
                    (int)(uVar6 << 0x1c) >> 0x1c);
      uVar34 = 2;
      goto LAB_009905ff;
    }
    iVar24 = (int)(uVar6 << 0x1c) >> 0x1c;
    goto LAB_0098f790;
  case 9:
    iVar24 = (int)cVar26;
    uVar28 = uVar14;
LAB_0098f790:
    gen_arith_imm((DisasContext_conflict6 *)dcbase,0x24000000,uVar28,uVar36,iVar24);
    break;
  case 10:
    uVar7 = 0x28000000;
    goto LAB_0098f758;
  case 0xb:
    uVar7 = 0x2c000000;
LAB_0098f758:
    gen_slt_imm((DisasContext_conflict6 *)dcbase,uVar7,0x18,uVar14,(ushort)uVar6 & 0xff);
    break;
  case 0xc:
    switch(uVar15) {
    case 0:
      uVar7 = 0x10000000;
      break;
    case 1:
      uVar7 = 0x14000000;
      break;
    case 2:
      uVar28 = 0x1f;
      goto LAB_0098f970;
    case 3:
      iVar24 = (int)cVar26 << 3;
      uVar14 = 0x1d;
      goto LAB_0098eba3;
    case 4:
      if ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar34 = (uint)dcbase[1].pc_next;
      iVar24 = 0x80;
      if ((uVar34 & 0xf) != 0) {
        iVar24 = (uVar34 & 0xf) * 8;
      }
      if ((char)uVar34 < '\0') {
        gen_mips16_save((DisasContext_conflict6 *)dcbase,0,0,uVar34 & 0x40,uVar34 & 0x20,
                        uVar34 & 0x10,iVar24);
      }
      else {
        gen_mips16_restore((DisasContext_conflict6 *)dcbase,0,0,uVar34 & 0x40,uVar34 & 0x20,
                           uVar34 & 0x10,iVar24);
      }
      goto LAB_0098e95e;
    case 5:
      uVar34 = *(uint *)(xlat_map + (ulong)(uVar6 & 7) * 4);
      uVar14 = uVar19 | uVar6 & 0x18;
      goto LAB_00990910;
    case 6:
LAB_00991191:
      iVar24 = 0x14;
      goto LAB_00991196;
    case 7:
      uVar14 = uVar28;
LAB_00990910:
      uVar6 = 0x21;
      uVar28 = 0;
LAB_00990913:
      gen_arith((DisasContext_conflict6 *)dcbase,uVar6,uVar14,uVar34,uVar28);
      goto LAB_0098f97a;
    }
    iVar24 = cVar26 * 2;
    uVar34 = 2;
    iVar16 = 2;
    uVar14 = 0x18;
    goto LAB_009905ed;
  case 0xd:
    tcg_gen_op2_mips64el
              (pTVar5,INDEX_op_movi_i64,
               (TCGArg)((long)&pTVar5->pool_cur + (long)pTVar5->cpu_gpr[(int)uVar14]),
               (ulong)(uVar6 & 0xff));
    break;
  case 0xe:
    gen_logic_imm((DisasContext_conflict6 *)dcbase,0x38000000,0x18,uVar14,(ushort)uVar6 & 0xff);
    break;
  case 0xf:
    if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    if ((dcbase[2].pc_next & 8) == 0) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    uVar34 = uVar34 << 3;
    uVar6 = 0xfc000000;
    goto LAB_0098fcd2;
  case 0x10:
    uVar6 = 0x80000000;
    goto LAB_0098f863;
  case 0x11:
    uVar34 = uVar34 * 2;
    uVar6 = 0x84000000;
    goto LAB_0098f863;
  case 0x12:
    uVar34 = (uVar6 & 0xff) << 2;
    uVar6 = 0x8c000000;
    uVar28 = uVar14;
    uVar14 = 0x1d;
    goto LAB_0098f863;
  case 0x13:
    uVar34 = uVar34 << 2;
    uVar6 = 0x8c000000;
    goto LAB_0098f863;
  case 0x14:
    uVar6 = 0x90000000;
    goto LAB_0098f863;
  case 0x15:
    uVar34 = uVar34 * 2;
    uVar6 = 0x94000000;
    goto LAB_0098f863;
  case 0x16:
    uVar34 = (uVar6 & 0xff) << 2;
    uVar6 = 0x8c000005;
    uVar28 = uVar14;
    uVar14 = 0;
LAB_0098f863:
    gen_ld((DisasContext_conflict6 *)dcbase,uVar6,uVar28,uVar14,uVar34);
    break;
  case 0x17:
    if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    if ((dcbase[2].pc_next & 8) == 0) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    uVar34 = uVar34 << 2;
    uVar6 = 0x9c000000;
    goto LAB_0098fc2a;
  case 0x18:
    uVar6 = 0xa0000000;
    goto LAB_0098f975;
  case 0x19:
    uVar34 = uVar34 * 2;
    uVar6 = 0xa4000000;
    goto LAB_0098f975;
  case 0x1a:
    uVar28 = uVar14;
LAB_0098f970:
    uVar34 = (uVar6 & 0xff) << 2;
    uVar6 = 0xac000000;
    uVar14 = 0x1d;
    goto LAB_0098f975;
  case 0x1b:
    uVar34 = uVar34 << 2;
    uVar6 = 0xac000000;
LAB_0098f975:
    gen_st((DisasContext_conflict6 *)dcbase,uVar6,uVar28,uVar14,uVar34);
    break;
  case 0x1c:
    uVar34 = *(uint *)(xlat_map + (ulong)uVar8 * 4);
    switch(uVar6 & 3) {
    case 0:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x2d;
      goto LAB_00990752;
    case 1:
      uVar6 = 0x21;
      break;
    case 2:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x2f;
LAB_00990752:
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      break;
    case 3:
      uVar6 = 0x23;
    }
LAB_009907a4:
    gen_arith((DisasContext_conflict6 *)dcbase,uVar6,uVar34,uVar14,uVar28);
    goto LAB_0098e95e;
  case 0x1d:
    uVar36 = uVar28;
    uVar8 = uVar14;
    switch(uVar34) {
    case 0:
      if (((uVar6 & 0x80) != 0) && ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT)) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar7 = 9 - ((uVar6 & 0x40) == 0);
      uVar34 = 0x1f;
      if ((uVar6 & 0x20) == 0) {
        uVar34 = uVar14;
      }
      uVar14 = uVar34;
      uVar36 = (uVar6 & 0x80) >> 6 ^ 2;
      uVar34 = 2;
      iVar16 = 2;
      uVar28 = 0x1f;
      iVar24 = 0;
      goto LAB_009905f0;
    case 1:
      if ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      iVar24 = 0x10;
      goto LAB_00991196;
    case 2:
      uVar6 = 0x2a;
      goto LAB_009910bc;
    case 3:
      uVar6 = 0x2b;
LAB_009910bc:
      gen_slt((DisasContext_conflict6 *)dcbase,uVar6,0x18,uVar14,uVar28);
      goto LAB_0098f97a;
    case 4:
      uVar6 = 4;
      goto LAB_009911d0;
    case 5:
      iVar24 = 0x12;
LAB_00991196:
      generate_exception_err((DisasContext_conflict6 *)dcbase,iVar24,0);
      goto LAB_0098f97a;
    case 6:
      uVar6 = 6;
      goto LAB_009911d0;
    case 7:
      uVar6 = 7;
      goto LAB_009911d0;
    case 8:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x3a;
      uVar14 = uVar28;
      goto LAB_009906f4;
    default:
switchD_0098f8fa_caseD_9:
      goto LAB_00991191;
    case 10:
      uVar6 = 0x26;
      uVar8 = 0x18;
      goto LAB_009910f7;
    case 0xb:
      uVar6 = 0x23;
      uVar34 = 0;
      goto LAB_00990913;
    case 0xc:
      uVar6 = 0x24;
      goto LAB_009910f7;
    case 0xd:
      uVar6 = 0x25;
      goto LAB_009910f7;
    case 0xe:
      uVar6 = 0x26;
      goto LAB_009910f7;
    case 0xf:
      uVar6 = 0x27;
      uVar36 = 0;
      uVar14 = uVar28;
LAB_009910f7:
      gen_logic((DisasContext_conflict6 *)dcbase,uVar6,uVar8,uVar14,uVar36);
      goto LAB_0098f97a;
    case 0x10:
      uVar6 = 0x10;
      goto LAB_0099113c;
    case 0x11:
      if ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      switch(uVar19) {
      case 0:
        tcg_gen_ext8u_i64_mips64el(pTVar5,pTVar5->cpu_gpr[(int)uVar14],pTVar5->cpu_gpr[(int)uVar14])
        ;
        break;
      case 1:
        tcg_gen_ext16u_i64_mips64el
                  (pTVar5,pTVar5->cpu_gpr[(int)uVar14],pTVar5->cpu_gpr[(int)uVar14]);
        break;
      case 2:
        if ((dcbase[1].is_jmp & 0x80) == DISAS_NEXT) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        if ((dcbase[2].pc_next & 8) == 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        tcg_gen_ext32u_i64_mips64el
                  (pTVar5,pTVar5->cpu_gpr[(int)uVar14],pTVar5->cpu_gpr[(int)uVar14]);
        break;
      default:
        goto switchD_0098f8fa_caseD_9;
      case 4:
        tcg_gen_ext8s_i64_mips64el(pTVar5,pTVar5->cpu_gpr[(int)uVar14],pTVar5->cpu_gpr[(int)uVar14])
        ;
        break;
      case 5:
        tcg_gen_ext16s_i64_mips64el
                  (pTVar5,pTVar5->cpu_gpr[(int)uVar14],pTVar5->cpu_gpr[(int)uVar14]);
        break;
      case 6:
        if ((dcbase[1].is_jmp & 0x80) == DISAS_NEXT) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        if ((dcbase[2].pc_next & 8) == 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        tcg_gen_ext32s_i64_mips64el
                  (pTVar5,pTVar5->cpu_gpr[(int)uVar14],pTVar5->cpu_gpr[(int)uVar14]);
      }
      uVar34 = 2;
      goto LAB_009905ff;
    case 0x12:
      uVar6 = 0x12;
LAB_0099113c:
      gen_HILO((DisasContext_conflict6 *)dcbase,uVar6,0,uVar14);
      goto LAB_0098f97a;
    case 0x13:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x3b;
      uVar14 = uVar28;
LAB_009906f4:
      gen_shift_imm((DisasContext_conflict6 *)dcbase,uVar6,uVar14,uVar28,iVar23);
      goto LAB_0098f97a;
    case 0x14:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x14;
      goto LAB_009911d0;
    case 0x16:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x16;
      goto LAB_009911d0;
    case 0x17:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x17;
LAB_009911d0:
      gen_shift((DisasContext_conflict6 *)dcbase,uVar6,uVar28,uVar14,uVar28);
      goto LAB_0098f97a;
    case 0x18:
      uVar6 = 0x18;
      break;
    case 0x19:
      uVar6 = 0x19;
      break;
    case 0x1a:
      uVar6 = 0x1a;
      break;
    case 0x1b:
      uVar6 = 0x1b;
      break;
    case 0x1c:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x1c;
      break;
    case 0x1d:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x1d;
      break;
    case 0x1e:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x1e;
      break;
    case 0x1f:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x1f;
    }
    gen_muldiv((DisasContext_conflict6 *)dcbase,uVar6,0,uVar14,uVar28);
    break;
  case 0x1e:
    uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next + 2);
    uVar28 = (int)dcbase[1].pc_next << 0x10 | uVar6;
    *(uint *)&dcbase[1].pc_next = uVar28;
    uVar34 = uVar6 >> 0xb & 0x1f;
    if (0x1f < uVar34) {
switchD_0098f816_caseD_3:
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      goto LAB_0099058f;
    }
    uVar8 = uVar6 >> 8 & 7;
    uVar14 = *(uint *)(xlat_map + (ulong)uVar8 * 4);
    uVar36 = *(uint *)(xlat_map + (uVar6 >> 3 & 0x1c));
    uVar19 = uVar28 >> 0x10;
    uVar22 = uVar19 << 0xb;
    uVar25 = uVar19 & 0x7e0;
    uVar15 = uVar6 & 0x1f;
    uVar18 = (ushort)uVar15 | (ushort)uVar25 | (ushort)uVar22;
    switch(uVar34) {
    case 0:
LAB_0098f827:
      iVar24 = (int)(short)uVar18;
      uVar6 = 0x24000000;
      uVar36 = uVar14;
      uVar14 = 0x1d;
      goto LAB_00990266;
    case 1:
      gen_addiupc((DisasContext_conflict6 *)dcbase,uVar14,(int)(short)uVar18,0,1);
      break;
    case 2:
      iVar24 = (short)uVar18 * 2;
      uVar34 = 4;
      iVar16 = 4;
      goto LAB_0098f570;
    default:
      goto switchD_0098f816_caseD_3;
    case 4:
      uVar7 = 0x10000000;
      goto LAB_009905e5;
    case 5:
      uVar7 = 0x14000000;
LAB_009905e5:
      iVar24 = (int)(short)uVar18;
      uVar34 = 4;
      iVar16 = 4;
      goto LAB_009905ea;
    case 6:
      switch(uVar6 & 3) {
      case 0:
        uVar6 = 0;
        break;
      case 1:
        if ((dcbase[2].pc_next & 8) == 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        uVar6 = 0x38;
        break;
      case 2:
        uVar6 = 2;
        break;
      case 3:
        uVar6 = 3;
      }
      gen_shift_imm((DisasContext_conflict6 *)dcbase,uVar6,uVar14,uVar36,
                    (ushort)(uVar28 >> 0x16) & 0x1f);
      break;
    case 7:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0xdc000000;
      goto LAB_00990e96;
    case 8:
      iVar24 = (int)((uVar19 & 0x7f0 | uVar6 & 0xf) << 0x11 | uVar19 << 0x1c) >> 0x11;
      if ((uVar6 & 0x10) == 0) {
        uVar6 = 0x24000000;
      }
      else {
        if ((dcbase[2].pc_next & 8) == 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        uVar6 = 0x64000000;
      }
      goto LAB_00990266;
    case 9:
      iVar24 = (int)(short)uVar18;
      uVar6 = 0x24000000;
      uVar36 = uVar14;
LAB_00990266:
      gen_arith_imm((DisasContext_conflict6 *)dcbase,uVar6,uVar36,uVar14,iVar24);
      break;
    case 10:
      uVar6 = 0x28000000;
      goto LAB_00990e46;
    case 0xb:
      uVar6 = 0x2c000000;
LAB_00990e46:
      gen_slt_imm((DisasContext_conflict6 *)dcbase,uVar6,0x18,uVar14,uVar18);
      break;
    case 0xc:
      switch((ulong)uVar8) {
      case 0:
        uVar6 = 0x10000000;
        break;
      case 1:
        uVar6 = 0x14000000;
        break;
      case 2:
        uVar14 = 0x1f;
        goto LAB_00990be7;
      case 3:
        uVar14 = 0x1d;
        goto LAB_0098f827;
      case 4:
        if ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        uVar34 = (uint)dcbase[1].pc_next;
        uVar36 = uVar34 >> 0x18 & 7;
        uVar14 = uVar34 >> 0x10 & 0xf;
        uVar28 = uVar34 >> 6 & 1;
        uVar8 = uVar34 >> 5 & 1;
        uVar15 = uVar34 >> 4 & 1;
        iVar24 = (uVar34 & 0xf | uVar34 >> 0x10 & 0xf0) << 3;
        if ((char)uVar34 < '\0') {
          gen_mips16_save((DisasContext_conflict6 *)dcbase,uVar36,uVar14,uVar28,uVar8,uVar15,iVar24)
          ;
        }
        else {
          gen_mips16_restore((DisasContext_conflict6 *)dcbase,uVar36,uVar14,uVar28,uVar8,uVar15,
                             iVar24);
        }
        goto LAB_0099058f;
      default:
        goto switchD_0098f816_caseD_3;
      }
      gen_compute_branch((DisasContext_conflict6 *)dcbase,uVar6,4,0x18,0,(short)uVar18 * 2,0);
      break;
    case 0xd:
      tcg_gen_op2_mips64el
                (pTVar5,INDEX_op_movi_i64,
                 (TCGArg)((long)&pTVar5->pool_cur + (long)pTVar5->cpu_gpr[(int)uVar14]),
                 (ulong)(uVar15 | uVar25 | uVar22 & 0xffff));
      break;
    case 0xe:
      tcg_gen_xori_i64_mips64el
                (pTVar5,pTVar5->cpu_gpr[0x18],pTVar5->cpu_gpr[(int)uVar14],
                 (ulong)(uVar15 | uVar25 | uVar22 & 0xffff));
      break;
    case 0xf:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0xfc000000;
      goto LAB_00990ec9;
    case 0x10:
      uVar6 = 0x80000000;
      goto LAB_00990e96;
    case 0x11:
      uVar6 = 0x84000000;
      goto LAB_00990e96;
    case 0x12:
      uVar6 = 0x8c000000;
      uVar36 = uVar14;
      uVar14 = 0x1d;
      goto LAB_00990e96;
    case 0x13:
      uVar6 = 0x8c000000;
      goto LAB_00990e96;
    case 0x14:
      uVar6 = 0x90000000;
      goto LAB_00990e96;
    case 0x15:
      uVar6 = 0x94000000;
      goto LAB_00990e96;
    case 0x16:
      uVar6 = 0x8c000005;
      uVar36 = uVar14;
      uVar14 = 0;
      goto LAB_00990e96;
    case 0x17:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar6 = 0x9c000000;
LAB_00990e96:
      gen_ld((DisasContext_conflict6 *)dcbase,uVar6,uVar36,uVar14,(int)(short)uVar18);
      break;
    case 0x18:
      uVar6 = 0xa0000000;
      goto LAB_00990ec9;
    case 0x19:
      uVar6 = 0xa4000000;
      goto LAB_00990ec9;
    case 0x1a:
LAB_00990be7:
      uVar6 = 0xac000000;
      uVar36 = uVar14;
      uVar14 = 0x1d;
      goto LAB_00990ec9;
    case 0x1b:
      uVar6 = 0xac000000;
LAB_00990ec9:
      gen_st((DisasContext_conflict6 *)dcbase,uVar6,uVar36,uVar14,(int)(short)uVar18);
      break;
    case 0x1f:
      decode_i64_mips16((DisasContext_conflict6 *)dcbase,uVar36,uVar8,uVar18,1);
    }
LAB_0099058f:
    uVar34 = 4;
    goto LAB_009905ff;
  case 0x1f:
    decode_i64_mips16((DisasContext_conflict6 *)dcbase,uVar28,uVar15,(int16_t)uVar34,0);
  }
LAB_0098f97a:
  uVar34 = 2;
LAB_009905ff:
  if (bVar35) {
    paVar29 = &pTVar2->ops;
    if (local_80 != (void *)0x0) {
      paVar29 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_80 + 8);
    }
    paVar29->tqh_first->args[1] = (ulong)uVar34;
  }
  uVar28 = (uint)dcbase[2].pc_next;
  if ((uVar28 & 0x87f800) != 0) {
    if ((uVar28 & 0x818000) == 0) {
      uVar32 = 1;
    }
    if ((~uVar28 & 0x800400) == 0) {
      uVar32 = 1;
    }
  }
  if (uVar32 != 0) {
    gen_branch((DisasContext_conflict6 *)dcbase,uVar34);
  }
  tVar21 = (ulong)uVar34 + dcbase->pc_next;
  dcbase->pc_next = tVar21;
  if (dcbase->is_jmp == DISAS_NEXT) {
    if ((dcbase->singlestep_enabled == true) && ((dcbase[2].pc_next & 0x87f800) == 0)) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
    if (0xfff < tVar21 - dcbase[1].pc_first) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  return;
}

Assistant:

static void mips_tr_translate_insn(DisasContextBase *dcbase, CPUState *cs)
{
    CPUMIPSState *env = cs->env_ptr;
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = cs->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *tcg_op, *prev_op = NULL;
    int insn_bytes;
    int is_slot;
    bool hook_insn = false;

    is_slot = ctx->hflags & MIPS_HFLAG_BMASK;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        // raise a special interrupt to quit
        gen_helper_wait(tcg_ctx, tcg_ctx->cpu_env);
        ctx->base.is_jmp = DISAS_NORETURN;
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, ctx->base.pc_next)) {

        // Sync PC in advance
        gen_save_pc(tcg_ctx, ctx->base.pc_next);

        // save the last operand
        prev_op = tcg_last_op(tcg_ctx);
        hook_insn = true;
        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, ctx->base.pc_next);
        // Don't let unicorn stop at the branch delay slot.
        if (!is_slot) {
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }
    }
    
    if (ctx->insn_flags & ISA_NANOMIPS32) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_nanomips_opc(env, ctx);
    } else if (!(ctx->hflags & MIPS_HFLAG_M16)) {
        ctx->opcode = cpu_ldl_code(env, ctx->base.pc_next);
        insn_bytes = 4;
        decode_opc(env, ctx);
    } else if (ctx->insn_flags & ASE_MICROMIPS) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_micromips_opc(env, ctx);
    } else if (ctx->insn_flags & ASE_MIPS16) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_mips16_opc(env, ctx);
    } else {
        generate_exception_end(ctx, EXCP_RI);
        g_assert(ctx->base.is_jmp == DISAS_NORETURN);
        return;
    }

    if (hook_insn) {
        // Unicorn: patch the callback to have the proper instruction size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this instruction is the first emulated code ever,
            // so the instruction operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = insn_bytes;
    }

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        if (!(ctx->hflags & (MIPS_HFLAG_BDS16 | MIPS_HFLAG_BDS32 |
                             MIPS_HFLAG_FBNSLOT))) {
            /*
             * Force to generate branch as there is neither delay nor
             * forbidden slot.
             */
            is_slot = 1;
        }
        if ((ctx->hflags & MIPS_HFLAG_M16) &&
            (ctx->hflags & MIPS_HFLAG_FBNSLOT)) {
            /*
             * Force to generate branch as microMIPS R6 doesn't restrict
             * branches in the forbidden slot.
             */
            is_slot = 1;
        }
    }
    if (is_slot) {
        gen_branch(ctx, insn_bytes);
    }
    ctx->base.pc_next += insn_bytes;

    if (ctx->base.is_jmp != DISAS_NEXT) {
        return;
    }
    /*
     * Execute a branch and its delay slot as a single instruction.
     * This is what GDB expects and is consistent with what the
     * hardware does (e.g. if a delay slot instruction faults, the
     * reported PC is the PC of the branch).
     */
    if (ctx->base.singlestep_enabled &&
        (ctx->hflags & MIPS_HFLAG_BMASK) == 0) {
        ctx->base.is_jmp = DISAS_TOO_MANY;
    }
    if (ctx->base.pc_next - ctx->page_start >= TARGET_PAGE_SIZE) {
        ctx->base.is_jmp = DISAS_TOO_MANY;
    }
}